

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yy_destructor(yyParser *yypParser,unsigned_short yymajor,YYMINORTYPE *yypminor)

{
  sqlite3 *db;
  Window *p;
  SrcList *in_RDX;
  ushort in_SI;
  long in_RDI;
  Parse *pParse;
  undefined6 in_stack_fffffffffffffff0;
  
  db = *(sqlite3 **)(in_RDI + 8);
  p = (Window *)(ulong)(in_SI - 0xce);
  switch(p) {
  case (Window *)0x0:
  case (Window *)0x23:
  case (Window *)0x24:
  case (Window *)0x30:
  case (Window *)0x32:
    sqlite3SelectDelete(db,(Select *)p);
    break;
  default:
    break;
  case (Window *)0xc:
  case (Window *)0xd:
  case (Window *)0x2a:
  case (Window *)0x2c:
  case (Window *)0x40:
  case (Window *)0x4b:
  case (Window *)0x4d:
  case (Window *)0x50:
  case (Window *)0x57:
  case (Window *)0x5c:
  case (Window *)0x6d:
    sqlite3ExprDelete(db,(Expr *)p);
    break;
  case (Window *)0x11:
  case (Window *)0x1b:
  case (Window *)0x1c:
  case (Window *)0x28:
  case (Window *)0x2b:
  case (Window *)0x2d:
  case (Window *)0x31:
  case (Window *)0x33:
  case (Window *)0x3a:
  case (Window *)0x41:
  case (Window *)0x4a:
  case (Window *)0x4c:
  case (Window *)0x6c:
    sqlite3ExprListDelete(db,(ExprList *)p);
    break;
  case (Window *)0x22:
  case (Window *)0x29:
  case (Window *)0x35:
  case (Window *)0x36:
  case (Window *)0x3b:
    sqlite3SrcListDelete((sqlite3 *)CONCAT26(in_SI,in_stack_fffffffffffffff0),in_RDX);
    break;
  case (Window *)0x25:
    sqlite3WithDelete(db,(With *)p);
    break;
  case (Window *)0x2f:
  case (Window *)0x68:
    sqlite3WindowListDelete(db,p);
    break;
  case (Window *)0x3c:
  case (Window *)0x43:
    sqlite3IdListDelete(db,(IdList *)p);
    break;
  case (Window *)0x46:
  case (Window *)0x69:
  case (Window *)0x6a:
  case (Window *)0x6b:
  case (Window *)0x6e:
    sqlite3WindowDelete(db,p);
    break;
  case (Window *)0x53:
  case (Window *)0x58:
    sqlite3DeleteTriggerStep(db,(TriggerStep *)p);
    break;
  case (Window *)0x55:
    sqlite3IdListDelete(db,(IdList *)p);
    break;
  case (Window *)0x70:
  case (Window *)0x71:
  case (Window *)0x72:
    sqlite3ExprDelete(db,(Expr *)p);
  }
  return;
}

Assistant:

static void yy_destructor(
  yyParser *yypParser,    /* The parser */
  YYCODETYPE yymajor,     /* Type code for object to destroy */
  YYMINORTYPE *yypminor   /* The object to be destroyed */
){
  sqlite3ParserARG_FETCH
  sqlite3ParserCTX_FETCH
  switch( yymajor ){
    /* Here is inserted the actions which take place when a
    ** terminal or non-terminal is destroyed.  This can happen
    ** when the symbol is popped from the stack during a
    ** reduce or during error processing or when a parser is
    ** being destroyed before it is finished parsing.
    **
    ** Note: during a reduce, the only symbols destroyed are those
    ** which appear on the RHS of the rule, but which are *not* used
    ** inside the C code.
    */
/********* Begin destructor definitions ***************************************/
    case 206: /* select */
    case 241: /* selectnowith */
    case 242: /* oneselect */
    case 254: /* values */
    case 256: /* mvalues */
{
sqlite3SelectDelete(pParse->db, (yypminor->yy637));
}
      break;
    case 218: /* term */
    case 219: /* expr */
    case 248: /* where_opt */
    case 250: /* having_opt */
    case 270: /* where_opt_ret */
    case 281: /* case_operand */
    case 283: /* case_else */
    case 286: /* vinto */
    case 293: /* when_clause */
    case 298: /* key_opt */
    case 315: /* filter_clause */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy590));
}
      break;
    case 223: /* eidlist_opt */
    case 233: /* sortlist */
    case 234: /* eidlist */
    case 246: /* selcollist */
    case 249: /* groupby_opt */
    case 251: /* orderby_opt */
    case 255: /* nexprlist */
    case 257: /* sclp */
    case 264: /* exprlist */
    case 271: /* setlist */
    case 280: /* paren_exprlist */
    case 282: /* case_exprlist */
    case 314: /* part_opt */
{
sqlite3ExprListDelete(pParse->db, (yypminor->yy402));
}
      break;
    case 240: /* fullname */
    case 247: /* from */
    case 259: /* seltablist */
    case 260: /* stl_prefix */
    case 265: /* xfullname */
{
sqlite3SrcListDelete(pParse->db, (yypminor->yy563));
}
      break;
    case 243: /* wqlist */
{
sqlite3WithDelete(pParse->db, (yypminor->yy125));
}
      break;
    case 253: /* window_clause */
    case 310: /* windowdefn_list */
{
sqlite3WindowListDelete(pParse->db, (yypminor->yy483));
}
      break;
    case 266: /* idlist */
    case 273: /* idlist_opt */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy204));
}
      break;
    case 276: /* filter_over */
    case 311: /* windowdefn */
    case 312: /* window */
    case 313: /* frame_opt */
    case 316: /* over_clause */
{
sqlite3WindowDelete(pParse->db, (yypminor->yy483));
}
      break;
    case 289: /* trigger_cmd_list */
    case 294: /* trigger_cmd */
{
sqlite3DeleteTriggerStep(pParse->db, (yypminor->yy319));
}
      break;
    case 291: /* trigger_event */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy28).b);
}
      break;
    case 318: /* frame_bound */
    case 319: /* frame_bound_s */
    case 320: /* frame_bound_e */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy205).pExpr);
}
      break;
/********* End destructor definitions *****************************************/
    default:  break;   /* If no destructor action specified: do nothing */
  }
}